

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

char * Cba_ObjGetName(Cba_Ntk_t *p,int i)

{
  int iVar1;
  Abc_Nam_t *p_00;
  Vec_Str_t *p_01;
  char *pName;
  int i_local;
  Cba_Ntk_t *p_local;
  
  p_local = (Cba_Ntk_t *)Cba_ObjNameStr(p,i);
  if (p_local != (Cba_Ntk_t *)0x0) {
    iVar1 = Cba_ObjName(p,i);
    iVar1 = Cba_NameIsLegalInVerilog((char *)p_local,iVar1);
    if (iVar1 == 0) {
      p_00 = Cba_NtkNam(p);
      p_01 = Abc_NamBuffer(p_00);
      p_local = (Cba_Ntk_t *)Vec_StrPrintF(p_01,"\\%s ",p_local);
    }
  }
  return (char *)p_local;
}

Assistant:

char * Cba_ObjGetName( Cba_Ntk_t * p, int i )
{
    char * pName = Cba_ObjNameStr(p, i);
    if ( pName == NULL )
        return pName;
    if ( Cba_NameIsLegalInVerilog(pName, Cba_ObjName(p, i)) )
        return pName;
    return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s ", pName );
}